

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_53a8f::mock_writer::mock_writer(mock_writer *this)

{
  int iVar1;
  int *piVar2;
  int local_40 [2];
  code *local_38;
  undefined8 local_30;
  code *local_28;
  code *local_20;
  
  local_40[0] = -1;
  local_30 = 0;
  local_38 = pstore::brokerface::writer::default_callback;
  local_20 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_28 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  pstore::brokerface::writer::writer(&this->super_writer,(UI *)local_40,(UI_STRING *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (-1 < local_40[0]) {
    close(local_40[0]);
  }
  *piVar2 = iVar1;
  (this->super_writer)._vptr_writer = (_func_int **)&PTR__mock_writer_00171630;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->gmock01_write_impl_36).super_UntypedFunctionMockerBase);
  (this->gmock01_write_impl_36).super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_001716e0;
  return;
}

Assistant:

mock_writer ()
                : pstore::brokerface::writer (make_pipe ()) {}